

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpgradeAI.cpp
# Opt level: O1

void __thiscall tiger::trains::ai::UpgradeAI::step(UpgradeAI *this)

{
  _Elt_pointer pvVar1;
  IUpgradeble *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer ppVar6;
  pointer ppVar7;
  long lVar8;
  int *piVar9;
  pointer ppVar10;
  int iVar11;
  ulong uVar12;
  
  iVar3 = world::Town::getArrmor(this->town);
  pvVar1 = (this->upgradeQueue).c.
           super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->upgradeQueue).c.
      super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pvVar1) {
    ppVar6 = (pvVar1->
             super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar7 = (pvVar1->
             super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 != ppVar6) {
      uVar12 = 0;
      iVar11 = 0;
      do {
        pIVar2 = ppVar6[uVar12].first;
        iVar5 = ppVar6[uVar12].second;
        iVar4 = (*pIVar2->_vptr_IUpgradeble[2])(pIVar2);
        if (iVar4 + 1 == iVar5) {
          iVar5 = (*pIVar2->_vptr_IUpgradeble[3])(pIVar2);
          if (iVar3 - this->RESERV_ARMOR <= iVar5) goto LAB_00155311;
          iVar5 = (*pIVar2->_vptr_IUpgradeble[5])(pIVar2);
          if ((char)iVar5 == '\0') goto LAB_00155311;
          (*pIVar2->_vptr_IUpgradeble[4])(pIVar2);
          iVar5 = (*pIVar2->_vptr_IUpgradeble[3])(pIVar2);
          ppVar6 = (pvVar1->
                   super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar7 = (pvVar1->
                   super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          ppVar10 = ppVar6 + uVar12 + 1;
          if ((ppVar10 != ppVar7) && (lVar8 = (long)ppVar7 - (long)ppVar10 >> 4, 0 < lVar8)) {
            lVar8 = lVar8 + 1;
            piVar9 = &ppVar6[uVar12 + 1].second;
            do {
              *(IUpgradeble **)(piVar9 + -6) =
                   ((pair<tiger::trains::world::IUpgradeble_*,_int> *)(piVar9 + -2))->first;
              piVar9[-4] = *piVar9;
              lVar8 = lVar8 + -1;
              piVar9 = piVar9 + 4;
            } while (1 < lVar8);
          }
          iVar3 = iVar3 - iVar5;
          (pvVar1->
          super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = ppVar7 + -1;
        }
        else {
LAB_00155311:
          iVar11 = iVar11 + 1;
        }
        uVar12 = (ulong)iVar11;
        ppVar6 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar12 < (ulong)((long)ppVar7 - (long)ppVar6 >> 4));
    }
    if (ppVar6 == ppVar7) {
      std::
      deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
      ::pop_front(&(this->upgradeQueue).c);
      return;
    }
  }
  return;
}

Assistant:

void UpgradeAI::step()
{
    int ar = town->getArrmor();

    if (upgradeQueue.empty())
        return;

    std::vector<std::pair<world::IUpgradeble *, int>> &upgradeVector = upgradeQueue.front();

    int i = 0;

    while (i < upgradeVector.size())
    {
        world::IUpgradeble *target = upgradeVector[i].first;
        int level = upgradeVector[i].second;

        if (target->getLevel() + 1 == level &&
                target->getNextLevelPrice() < ar - RESERV_ARMOR &&
                target->isReadyToUpgrade())
        {
            target->upgrade();
            ar -= target->getNextLevelPrice();
            upgradeVector.erase(upgradeVector.begin() + i);
        }
        else
            i++;
    }

    if (upgradeVector.empty())
        upgradeQueue.pop();

}